

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O3

int slang::ast::Pattern::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxKind SVar1;
  Compilation *this;
  Pattern *pPVar2;
  undefined4 in_register_00000014;
  Type *targetType;
  undefined4 in_register_0000003c;
  ASTContext *context;
  SourceRange local_20;
  
  context = (ASTContext *)CONCAT44(in_register_0000003c,__fd);
  targetType = (Type *)CONCAT44(in_register_00000014,__len);
  while (SVar1 = (((StructurePatternSyntax *)__addr)->super_PatternSyntax).super_SyntaxNode.kind,
        SVar1 == ParenthesizedPattern) {
    __addr = (sockaddr *)
             (((StructurePatternSyntax *)__addr)->members).super_SyntaxListBase._vptr_SyntaxListBase
    ;
  }
  if ((int)SVar1 < 0x1c9) {
    if (SVar1 == ExpressionPattern) {
      pPVar2 = ConstantPattern::fromSyntax((ExpressionPatternSyntax *)__addr,targetType,context);
    }
    else {
      pPVar2 = StructurePattern::fromSyntax((StructurePatternSyntax *)__addr,targetType,context);
    }
  }
  else if (SVar1 == TaggedPattern) {
    pPVar2 = TaggedPattern::fromSyntax((TaggedPatternSyntax *)__addr,targetType,context);
  }
  else if (SVar1 == VariablePattern) {
    pPVar2 = VariablePattern::fromSyntax((VariablePatternSyntax *)__addr,context);
  }
  else {
    this = ((context->scope).ptr)->compilation;
    local_20 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)__addr);
    pPVar2 = &BumpAllocator::emplace<slang::ast::WildcardPattern,slang::SourceRange>
                        (&this->super_BumpAllocator,&local_20)->super_Pattern;
  }
  pPVar2->syntax = (SyntaxNode *)__addr;
  return (int)pPVar2;
}

Assistant:

Pattern& Pattern::bind(const ASTContext& context, const syntax::PatternSyntax& syntax,
                       const Type& targetType) {
    Pattern* result;
    switch (syntax.kind) {
        case SyntaxKind::ParenthesizedPattern:
            return bind(context, *syntax.as<ParenthesizedPatternSyntax>().pattern, targetType);
        case SyntaxKind::WildcardPattern:
            result = &WildcardPattern::fromSyntax(syntax.as<WildcardPatternSyntax>(), context);
            break;
        case SyntaxKind::ExpressionPattern:
            result = &ConstantPattern::fromSyntax(syntax.as<ExpressionPatternSyntax>(), targetType,
                                                  context);
            break;
        case SyntaxKind::VariablePattern:
            result = &VariablePattern::fromSyntax(syntax.as<VariablePatternSyntax>(), context);
            break;
        case SyntaxKind::TaggedPattern:
            result = &TaggedPattern::fromSyntax(syntax.as<TaggedPatternSyntax>(), targetType,
                                                context);
            break;
        case SyntaxKind::StructurePattern:
            result = &StructurePattern::fromSyntax(syntax.as<StructurePatternSyntax>(), targetType,
                                                   context);
            break;
        default:
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}